

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O2

int spng_get_splt(spng_ctx *ctx,spng_splt *splt,uint32_t *n_splt)

{
  int iVar1;
  
  iVar1 = 1;
  if ((ctx != (spng_ctx *)0x0) && (iVar1 = read_chunks(ctx,0), iVar1 == 0)) {
    if (((ctx->stored).field_0x1 & 0x10) == 0) {
      iVar1 = 0x49;
    }
    else {
      iVar1 = 1;
      if (n_splt != (uint32_t *)0x0) {
        if (splt == (spng_splt *)0x0) {
          *n_splt = ctx->n_splt;
        }
        else {
          if (*n_splt < ctx->n_splt) {
            return 1;
          }
          memcpy(splt,ctx->splt_list,(ulong)ctx->n_splt * 0x60);
        }
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int spng_get_splt(spng_ctx *ctx, struct spng_splt *splt, uint32_t *n_splt)
{
    if(ctx == NULL) return 1;
    int ret = read_chunks(ctx, 0);
    if(ret) return ret;
    if(!ctx->stored.splt) return SPNG_ECHUNKAVAIL;
    if(n_splt == NULL) return 1;

    if(splt == NULL)
    {
        *n_splt = ctx->n_splt;
        return 0;
    }

    if(*n_splt < ctx->n_splt) return 1;

    memcpy(splt, ctx->splt_list, ctx->n_splt * sizeof(struct spng_splt));

    return 0;
}